

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_request_copy(Terminal *term,int *clipboards,wchar_t n_clipboards)

{
  wchar_t wVar1;
  ulong uVar2;
  
  if (L'\0' < n_clipboards) {
    uVar2 = 0;
    do {
      wVar1 = clipboards[uVar2];
      if (wVar1 != L'\0') {
        if (wVar1 == L'\x01') {
          __assert_fail("clipboards[i] != CLIP_LOCAL",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x19fc,"void term_request_copy(Terminal *, const int *, int)");
        }
        (*term->win->vt->clip_write)
                  (term->win,wVar1,term->last_selected_text,term->last_selected_attr,
                   term->last_selected_tc,(wchar_t)term->last_selected_len,false);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n_clipboards != uVar2);
  }
  return;
}

Assistant:

void term_request_copy(Terminal *term, const int *clipboards, int n_clipboards)
{
    int i;
    for (i = 0; i < n_clipboards; i++) {
        assert(clipboards[i] != CLIP_LOCAL);
        if (clipboards[i] != CLIP_NULL) {
            win_clip_write(term->win, clipboards[i],
                           term->last_selected_text, term->last_selected_attr,
                           term->last_selected_tc, term->last_selected_len,
                           false);
        }
    }
}